

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O1

vec<4UL,_double> * __thiscall
mat<4UL,_4UL>::col(vec<4UL,_double> *__return_storage_ptr__,mat<4UL,_4UL> *this,size_t idx)

{
  long lVar1;
  
  if (idx < 4) {
    __return_storage_ptr__->data[2] = 0.0;
    __return_storage_ptr__->data[3] = 0.0;
    __return_storage_ptr__->data[0] = 0.0;
    __return_storage_ptr__->data[1] = 0.0;
    lVar1 = 0x18;
    do {
      *(undefined8 *)((long)__return_storage_ptr__->data + lVar1) =
           *(undefined8 *)((long)this->rows[0].data + lVar1 * 4 + idx * 8);
      lVar1 = lVar1 + -8;
    } while (lVar1 != -8);
    return __return_storage_ptr__;
  }
  __assert_fail("idx >= 0 && idx < ncols",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                ,0xb5,"vec<nrows, double> mat<4, 4>::col(const size_t) const [nrows = 4, ncols = 4]"
               );
}

Assistant:

vec<nrows, double> col(const size_t idx) const
    {
        assert(idx >= 0 && idx < ncols);
        vec<nrows, double> ret;
        for (size_t i = nrows; i--; ret[i] = rows[i][idx])
            ;
        return ret;
    }